

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall embree::HeightField::geometry(HeightField *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  pointer pTVar5;
  int iVar6;
  undefined8 uVar7;
  OBJMaterial *this_00;
  TriangleMeshNode *this_01;
  Vec3fa *pVVar8;
  size_t i;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t in_RSI;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_02;
  size_t x;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  allocator local_b1;
  long local_b0;
  OBJMaterial *local_a8;
  long local_a0;
  Ref<embree::SceneGraph::MaterialNode> local_98;
  Node *local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  long local_70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  string local_50;
  
  local_90 = (Node *)this;
  this_00 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
  local_88._0_8_ = 0x3f8000003f800000;
  local_88._8_8_ = 0x3f8000003f800000;
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  std::__cxx11::string::string((string *)&local_50,"",&local_b1);
  OBJMaterial::OBJMaterial
            (this_00,1.0,(Vec3fa *)&local_88.field_1,(Vec3fa *)&local_68.field_1,1.0,&local_50);
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  local_a8 = this_00;
  std::__cxx11::string::~string((string *)&local_50);
  this_01 = (TriangleMeshNode *)::operator_new(0xd8);
  local_98.ptr = &local_a8->super_MaterialNode;
  (*(local_a8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
  SceneGraph::TriangleMeshNode::TriangleMeshNode(this_01,&local_98,(BBox1f)0x3f8000003f800000,0);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if ((OBJMaterial *)local_98.ptr != (OBJMaterial *)0x0) {
    (*(((Node *)&((local_98.ptr)->super_Node).super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  sVar3 = *(size_t *)(*(long *)(in_RSI + 0x10) + 0x10);
  local_b0 = *(long *)(*(long *)(in_RSI + 0x10) + 0x18);
  pvVar4 = (this_01->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar19 = local_b0 * sVar3;
  uVar9 = pvVar4->size_alloced;
  uVar12 = uVar9;
  if ((uVar9 < uVar19) && (uVar11 = uVar9, uVar12 = uVar19, uVar9 != 0)) {
    for (; uVar12 = uVar11, uVar11 < uVar19; uVar11 = uVar11 * 2 + (ulong)(uVar11 * 2 == 0)) {
    }
  }
  if (uVar19 < pvVar4->size_active) {
    pvVar4->size_active = uVar19;
  }
  if (uVar9 == uVar12) {
    pvVar4->size_active = uVar19;
  }
  else {
    ptr = pvVar4->items;
    pVVar8 = (Vec3fa *)alignedMalloc(uVar12 << 4,0x10);
    pvVar4->items = pVVar8;
    lVar13 = 0;
    for (uVar9 = 0; uVar9 < pvVar4->size_active; uVar9 = uVar9 + 1) {
      puVar2 = (undefined8 *)((long)&ptr->field_0 + lVar13);
      uVar7 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar13);
      *puVar1 = *puVar2;
      puVar1[1] = uVar7;
      lVar13 = lVar13 + 0x10;
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar19;
    pvVar4->size_alloced = uVar12;
  }
  local_70 = sVar3 << 4;
  local_a0 = 0;
  for (lVar13 = 0; lVar13 != local_b0; lVar13 = lVar13 + 1) {
    lVar20 = local_a0;
    for (sVar18 = 0; sVar3 != sVar18; sVar18 = sVar18 + 1) {
      at((HeightField *)&local_88.field_1,in_RSI,sVar18);
      puVar1 = (undefined8 *)
               ((long)&((this_01->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar20);
      *puVar1 = local_88._0_8_;
      puVar1[1] = local_88._8_8_;
      lVar20 = lVar20 + 0x10;
    }
    local_a0 = local_a0 + local_70;
  }
  this_02 = &this_01->triangles;
  local_b0 = local_b0 + -1;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(this_02,(sVar3 - 1) * local_b0 * 2);
  lVar13 = 0;
  lVar20 = 0;
  lVar14 = 0;
  sVar18 = sVar3;
  while (lVar14 != local_b0) {
    lVar14 = lVar14 + 1;
    lVar15 = lVar13;
    for (lVar17 = 0; sVar3 - 1 != lVar17; lVar17 = lVar17 + 1) {
      iVar6 = (int)lVar17;
      iVar10 = (int)lVar20 + iVar6 + 1;
      iVar16 = iVar6 + (int)sVar18;
      pTVar5 = (this_02->
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(int *)((long)&pTVar5->v0 + lVar15) = (int)lVar20 + iVar6;
      *(int *)((long)&pTVar5->v1 + lVar15) = iVar10;
      *(int *)((long)&pTVar5->v2 + lVar15) = iVar16;
      pTVar5 = (this_02->
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(int *)((long)&pTVar5[1].v0 + lVar15) = iVar10;
      *(int *)((long)&pTVar5[1].v1 + lVar15) = (int)sVar18 + iVar6 + 1;
      *(int *)((long)&pTVar5[1].v2 + lVar15) = iVar16;
      lVar15 = lVar15 + 0x18;
    }
    lVar20 = lVar20 + sVar3;
    sVar18 = sVar18 + sVar3;
    lVar13 = lVar13 + sVar3 * 0x18 + -0x18;
  }
  (local_90->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])();
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])();
  (*(local_a8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
  return (Ref<embree::SceneGraph::Node>)local_90;
}

Assistant:

Ref<SceneGraph::Node> geometry()
    {
      Ref<SceneGraph::MaterialNode> mnode = new OBJMaterial(1.0f,Vec3fa(1.0f),Vec3fa(0.0f),1.0f);
      Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(mnode,1);

      const size_t width = texture->width;
      const size_t height = texture->height;
      
      mesh->positions[0].resize(height*width);
      for (size_t y=0; y<height; y++) 
        for (size_t x=0; x<width; x++) 
          mesh->positions[0][y*width+x] = at(x,y);

      mesh->triangles.resize(2*(height-1)*(width-1));
      for (size_t y=0; y<height-1; y++) {
        for (size_t x=0; x<width-1; x++) {
          const size_t p00 = (y+0)*width+(x+0);
          const size_t p01 = (y+0)*width+(x+1);
          const size_t p10 = (y+1)*width+(x+0);
          const size_t p11 = (y+1)*width+(x+1);
          const size_t tri = y*(width-1)+x;
          mesh->triangles[2*tri+0] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p00),unsigned(p01),unsigned(p10));
          mesh->triangles[2*tri+1] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p01),unsigned(p11),unsigned(p10));
        }
      }
      return mesh.dynamicCast<SceneGraph::Node>();
    }